

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall libtorrent::dht::dht_tracker::update_stats_counters(dht_tracker *this,counters *c)

{
  int iVar1;
  int extraout_var;
  _Base_ptr p_Var2;
  long extraout_RDX;
  _Rb_tree_header *p_Var3;
  int local_2c;
  int local_28;
  undefined4 local_24;
  
  iVar1 = (*this->m_storage->_vptr_dht_storage_interface[10])();
  counters::set_value(c,0x111,(long)iVar1);
  counters::set_value(c,0x112,(long)extraout_var);
  counters::set_value(c,0x113,(long)(int)extraout_RDX);
  counters::set_value(c,0x114,extraout_RDX >> 0x20);
  counters::set_value(c,0x10f,0);
  counters::set_value(c,0x110,0);
  counters::set_value(c,0x115,0);
  p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      dht::node::get_stats_counters((node *)&stack0xffffffffffffffd4);
      counters::inc_stats_counter(c,0x10f,(long)(int)local_24);
      counters::inc_stats_counter(c,0x110,(long)local_28);
      counters::inc_stats_counter(c,0x115,(long)local_2c);
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void dht_tracker::update_stats_counters(counters& c) const
	{
		const dht_storage_counters& dht_cnt = m_storage.counters();
		c.set_value(counters::dht_torrents, dht_cnt.torrents);
		c.set_value(counters::dht_peers, dht_cnt.peers);
		c.set_value(counters::dht_immutable_data, dht_cnt.immutable_data);
		c.set_value(counters::dht_mutable_data, dht_cnt.mutable_data);

		c.set_value(counters::dht_nodes, 0);
		c.set_value(counters::dht_node_cache, 0);
		c.set_value(counters::dht_allocated_observers, 0);

		for (auto const& n : m_nodes)
			add_dht_counters(n.second.dht, c);
	}